

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O3

void duckdb::ValidityRevertAppend(ColumnSegment *segment,idx_t start_row)

{
  ulong *puVar1;
  data_ptr_t pdVar2;
  BufferManager *pBVar3;
  ulong uVar4;
  idx_t iVar5;
  idx_t i;
  ulong uVar6;
  BufferHandle handle;
  BufferHandle local_30;
  
  uVar6 = start_row - (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  pBVar3 = BufferManager::GetBufferManager(segment->db);
  (*pBVar3->_vptr_BufferManager[7])(&local_30,pBVar3,&segment->block);
  uVar4 = uVar6;
  if ((uVar6 & 7) != 0) {
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_30.node);
    uVar4 = (uVar6 & 0xfffffffffffffff8) + 8;
    pdVar2 = (local_30.node.ptr)->buffer;
    for (; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      if (pdVar2 != (data_ptr_t)0x0) {
        puVar1 = (ulong *)(pdVar2 + (uVar6 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar6 & 0x3f);
      }
    }
  }
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_30.node);
  pdVar2 = (local_30.node.ptr)->buffer;
  iVar5 = ColumnSegment::SegmentSize(segment);
  switchD_012e3010::default(pdVar2 + (uVar4 >> 3),0xff,iVar5 - (uVar4 >> 3));
  BufferHandle::~BufferHandle(&local_30);
  return;
}

Assistant:

void ValidityRevertAppend(ColumnSegment &segment, idx_t start_row) {
	idx_t start_bit = start_row - segment.start;

	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto handle = buffer_manager.Pin(segment.block);
	idx_t revert_start;
	if (start_bit % 8 != 0) {
		// handle sub-bit stuff (yay)
		idx_t byte_pos = start_bit / 8;
		idx_t bit_end = (byte_pos + 1) * 8;
		ValidityMask mask(reinterpret_cast<validity_t *>(handle.Ptr()), segment.count);
		for (idx_t i = start_bit; i < bit_end; i++) {
			mask.SetValid(i);
		}
		revert_start = bit_end / 8;
	} else {
		revert_start = start_bit / 8;
	}
	// for the rest, we just memset
	memset(handle.Ptr() + revert_start, 0xFF, segment.SegmentSize() - revert_start);
}